

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O3

void glslang::OptimizerMesssageConsumer
               (spv_message_level_t level,char *source,spv_position_t *position,char *message)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  if (level < SPV_MSG_WARNING) {
    pcVar4 = "error: ";
    lVar3 = 7;
  }
  else if (level - SPV_MSG_INFO < 2) {
    pcVar4 = "info: ";
    lVar3 = 6;
  }
  else {
    if (level != SPV_MSG_WARNING) goto LAB_003e238d;
    pcVar4 = "warning: ";
    lVar3 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar3);
LAB_003e238d:
  if (source != (char *)0x0) {
    sVar1 = strlen(source);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,source,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  if (message != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    sVar1 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,message,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return;
}

Assistant:

void OptimizerMesssageConsumer(spv_message_level_t level, const char *source,
        const spv_position_t &position, const char *message)
{
    auto &out = std::cerr;
    switch (level)
    {
    case SPV_MSG_FATAL:
    case SPV_MSG_INTERNAL_ERROR:
    case SPV_MSG_ERROR:
        out << "error: ";
        break;
    case SPV_MSG_WARNING:
        out << "warning: ";
        break;
    case SPV_MSG_INFO:
    case SPV_MSG_DEBUG:
        out << "info: ";
        break;
    default:
        break;
    }
    if (source)
    {
        out << source << ":";
    }
    out << position.line << ":" << position.column << ":" << position.index << ":";
    if (message)
    {
        out << " " << message;
    }
    out << std::endl;
}